

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.cpp
# Opt level: O2

void md5_process(md5_context *ctx,uchar *data)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  
  uVar1 = ctx->state[3];
  uVar25 = (ulong)*(uint *)data;
  uVar21 = (ulong)*(uint *)(data + 4);
  uVar18 = (ulong)*(uint *)(data + 8);
  uVar2 = ctx->state[1];
  uVar3 = ctx->state[2];
  uVar22 = (ulong)*(uint *)(data + 0x24);
  uVar16 = (ulong)*(uint *)(data + 0x38);
  uVar5 = (uVar3 & uVar2 | ~uVar2 & uVar1) + uVar25 + ctx->state[0] + 0xd76aa478;
  uVar10 = uVar5 * 0x80 + uVar2 + (uVar5 >> 0x19 & 0x7f);
  uVar9 = (ulong)*(uint *)(data + 0x18);
  uVar5 = (uVar2 & uVar10 | ~uVar10 & uVar3) + uVar21 + uVar1 + 0xe8c7b756;
  uVar7 = uVar5 * 0x1000 + uVar10 + (uVar5 >> 0x14 & 0xfff);
  uVar5 = uVar18 + uVar3 + 0x242070db + (uVar10 & uVar7 | ~uVar7 & uVar2);
  uVar8 = uVar5 * 0x20000 + uVar7 + (uVar5 >> 0xf & 0x1ffff);
  uVar6 = (ulong)*(uint *)(data + 0xc);
  uVar5 = (uVar7 & uVar8 | ~uVar8 & uVar10) + uVar6 + uVar2 + 0xc1bdceee;
  uVar4 = uVar5 * 0x400000 + uVar8 + (uVar5 >> 10 & 0x3fffff);
  uVar15 = (ulong)*(uint *)(data + 0x10);
  uVar5 = uVar10 + uVar15 + (uVar8 & uVar4 | ~uVar4 & uVar7) + 0xf57c0faf;
  uVar19 = uVar5 * 0x80 + uVar4 + (uVar5 >> 0x19 & 0x7f);
  uVar12 = (ulong)*(uint *)(data + 0x14);
  uVar5 = uVar7 + uVar12 + 0x4787c62a + (uVar4 & uVar19 | ~uVar19 & uVar8);
  uVar7 = uVar5 * 0x1000 + uVar19 + (uVar5 >> 0x14 & 0xfff);
  uVar5 = uVar8 + uVar9 + (uVar19 & uVar7 | ~uVar7 & uVar4) + 0xa8304613;
  uVar8 = uVar5 * 0x20000 + uVar7 + (uVar5 >> 0xf & 0x1ffff);
  uVar10 = (ulong)*(uint *)(data + 0x1c);
  uVar5 = uVar4 + uVar10 + (uVar7 & uVar8 | ~uVar8 & uVar19) + 0xfd469501;
  uVar4 = uVar5 * 0x400000 + uVar8 + (uVar5 >> 10 & 0x3fffff);
  uVar11 = (ulong)*(uint *)(data + 0x20);
  uVar5 = uVar19 + uVar11 + 0x698098d8 + (uVar8 & uVar4 | ~uVar4 & uVar7);
  uVar20 = (ulong)*(uint *)(data + 0x28);
  uVar23 = uVar5 * 0x80 + uVar4 + (uVar5 >> 0x19 & 0x7f);
  uVar5 = uVar7 + uVar22 + (uVar4 & uVar23 | ~uVar23 & uVar8) + 0x8b44f7af;
  uVar7 = uVar5 * 0x1000 + uVar23 + (uVar5 >> 0x14 & 0xfff);
  uVar5 = uVar8 + uVar20 + (uVar23 & uVar7 | ~uVar7 & uVar4) + 0xffff5bb1;
  uVar8 = uVar5 * 0x20000 + uVar7 + (uVar5 >> 0xf & 0x1ffff);
  uVar13 = (ulong)*(uint *)(data + 0x2c);
  uVar5 = uVar4 + uVar13 + (uVar7 & uVar8 | ~uVar8 & uVar23) + 0x895cd7be;
  uVar19 = uVar5 * 0x400000 + uVar8 + (uVar5 >> 10 & 0x3fffff);
  uVar14 = (ulong)*(uint *)(data + 0x30);
  uVar5 = uVar23 + uVar14 + 0x6b901122 + (uVar8 & uVar19 | ~uVar19 & uVar7);
  uVar4 = uVar5 * 0x80 + uVar19 + (uVar5 >> 0x19 & 0x7f);
  uVar24 = (ulong)*(uint *)(data + 0x34);
  uVar17 = (ulong)*(uint *)(data + 0x3c);
  uVar5 = uVar7 + uVar24 + (uVar19 & uVar4 | ~uVar4 & uVar8) + 0xfd987193;
  uVar7 = uVar5 * 0x1000 + uVar4 + (uVar5 >> 0x14 & 0xfff);
  uVar5 = uVar8 + uVar16 + (uVar4 & uVar7 | ~uVar7 & uVar19) + 0xa679438e;
  uVar8 = uVar5 * 0x20000 + uVar7 + (uVar5 >> 0xf & 0x1ffff);
  uVar5 = uVar19 + uVar17 + 0x49b40821 + (uVar7 & uVar8 | ~uVar8 & uVar4);
  uVar19 = uVar5 * 0x400000 + uVar8 + (uVar5 >> 10 & 0x3fffff);
  uVar5 = uVar4 + uVar21 + (~uVar7 & uVar8 | uVar19 & uVar7) + 0xf61e2562;
  uVar4 = uVar5 * 0x20 + uVar19 + (uVar5 >> 0x1b & 0x1f);
  uVar5 = uVar7 + uVar9 + (~uVar8 & uVar19 | uVar4 & uVar8) + 0xc040b340;
  uVar23 = uVar5 * 0x200 + uVar4 + (uVar5 >> 0x17 & 0x1ff);
  uVar5 = uVar8 + uVar13 + 0x265e5a51 + (~uVar19 & uVar4 | uVar23 & uVar19);
  uVar7 = uVar5 * 0x4000 + uVar23 + (uVar5 >> 0x12 & 0x3fff);
  uVar5 = uVar19 + uVar25 + (~uVar4 & uVar23 | uVar7 & uVar4) + 0xe9b6c7aa;
  uVar8 = uVar5 * 0x100000 + uVar7 + (uVar5 >> 0xc & 0xfffff);
  uVar5 = uVar4 + uVar12 + (~uVar23 & uVar7 | uVar8 & uVar23) + 0xd62f105d;
  uVar19 = uVar5 * 0x20 + uVar8 + (uVar5 >> 0x1b & 0x1f);
  uVar5 = uVar23 + uVar20 + 0x2441453 + (~uVar7 & uVar8 | uVar19 & uVar7);
  uVar4 = uVar5 * 0x200 + uVar19 + (uVar5 >> 0x17 & 0x1ff);
  uVar5 = uVar7 + uVar17 + (~uVar8 & uVar19 | uVar4 & uVar8) + 0xd8a1e681;
  uVar7 = uVar5 * 0x4000 + uVar4 + (uVar5 >> 0x12 & 0x3fff);
  uVar5 = uVar8 + uVar15 + (~uVar19 & uVar4 | uVar7 & uVar19) + 0xe7d3fbc8;
  uVar23 = uVar5 * 0x100000 + uVar7 + (uVar5 >> 0xc & 0xfffff);
  uVar5 = uVar19 + uVar22 + 0x21e1cde6 + (~uVar4 & uVar7 | uVar23 & uVar4);
  uVar8 = uVar5 * 0x20 + uVar23 + (uVar5 >> 0x1b & 0x1f);
  uVar5 = uVar4 + uVar16 + (~uVar7 & uVar23 | uVar8 & uVar7) + 0xc33707d6;
  uVar19 = uVar5 * 0x200 + uVar8 + (uVar5 >> 0x17 & 0x1ff);
  uVar5 = uVar7 + uVar6 + (~uVar23 & uVar8 | uVar19 & uVar23) + 0xf4d50d87;
  uVar7 = uVar5 * 0x4000 + uVar19 + (uVar5 >> 0x12 & 0x3fff);
  uVar5 = uVar23 + uVar11 + 0x455a14ed + (~uVar8 & uVar19 | uVar7 & uVar8);
  uVar4 = uVar5 * 0x100000 + uVar7 + (uVar5 >> 0xc & 0xfffff);
  uVar5 = uVar8 + uVar24 + (~uVar19 & uVar7 | uVar4 & uVar19) + 0xa9e3e905;
  uVar8 = uVar5 * 0x20 + uVar4 + (uVar5 >> 0x1b & 0x1f);
  uVar5 = uVar19 + uVar18 + (~uVar7 & uVar4 | uVar8 & uVar7) + 0xfcefa3f8;
  uVar19 = uVar5 * 0x200 + uVar8 + (uVar5 >> 0x17 & 0x1ff);
  uVar5 = uVar7 + uVar10 + 0x676f02d9 + (~uVar4 & uVar8 | uVar19 & uVar4);
  uVar7 = uVar5 * 0x4000 + uVar19 + (uVar5 >> 0x12 & 0x3fff);
  uVar5 = uVar4 + uVar14 + ((uVar7 ^ uVar19) & uVar8 ^ uVar19) + 0x8d2a4c8a;
  uVar23 = uVar5 * 0x100000 + uVar7 + (uVar5 >> 0xc & 0xfffff);
  uVar5 = uVar8 + uVar12 + (uVar7 ^ uVar19 ^ uVar23) + 0xfffa3942;
  uVar4 = uVar5 * 0x10 + uVar23 + (uVar5 >> 0x1c & 0xf);
  uVar5 = uVar19 + uVar11 + (uVar23 ^ uVar7 ^ uVar4) + 0x8771f681;
  uVar19 = uVar5 * 0x800 + uVar4 + (uVar5 >> 0x15 & 0x7ff);
  uVar5 = (uVar4 ^ uVar23 ^ uVar19) + 0x6d9d6122 + uVar7 + uVar13;
  uVar7 = uVar5 * 0x10000 + uVar19 + (uVar5 >> 0x10 & 0xffff);
  uVar5 = uVar23 + uVar16 + (uVar19 ^ uVar4 ^ uVar7) + 0xfde5380c;
  uVar8 = uVar5 * 0x800000 + uVar7 + (uVar5 >> 9 & 0x7fffff);
  uVar5 = uVar4 + uVar21 + (uVar7 ^ uVar19 ^ uVar8) + 0xa4beea44;
  uVar23 = uVar5 * 0x10 + uVar8 + (uVar5 >> 0x1c & 0xf);
  uVar5 = (uVar8 ^ uVar7 ^ uVar23) + 0x4bdecfa9 + uVar19 + uVar15;
  uVar4 = uVar5 * 0x800 + uVar23 + (uVar5 >> 0x15 & 0x7ff);
  uVar5 = uVar7 + uVar10 + (uVar23 ^ uVar8 ^ uVar4) + 0xf6bb4b60;
  uVar7 = uVar5 * 0x10000 + uVar4 + (uVar5 >> 0x10 & 0xffff);
  uVar5 = uVar8 + uVar20 + (uVar4 ^ uVar23 ^ uVar7) + 0xbebfbc70;
  uVar19 = uVar5 * 0x800000 + uVar7 + (uVar5 >> 9 & 0x7fffff);
  uVar5 = (uVar7 ^ uVar4 ^ uVar19) + 0x289b7ec6 + uVar23 + uVar24;
  uVar8 = uVar5 * 0x10 + uVar19 + (uVar5 >> 0x1c & 0xf);
  uVar5 = uVar4 + uVar25 + (uVar19 ^ uVar7 ^ uVar8) + 0xeaa127fa;
  uVar4 = uVar5 * 0x800 + uVar8 + (uVar5 >> 0x15 & 0x7ff);
  uVar5 = uVar7 + uVar6 + (uVar8 ^ uVar19 ^ uVar4) + 0xd4ef3085;
  uVar23 = uVar5 * 0x10000 + uVar4 + (uVar5 >> 0x10 & 0xffff);
  uVar5 = (uVar4 ^ uVar8 ^ uVar23) + 0x4881d05 + uVar19 + uVar9;
  uVar7 = uVar5 * 0x800000 + uVar23 + (uVar5 >> 9 & 0x7fffff);
  uVar5 = uVar8 + uVar22 + (uVar23 ^ uVar4 ^ uVar7) + 0xd9d4d039;
  uVar19 = uVar5 * 0x10 + uVar7 + (uVar5 >> 0x1c & 0xf);
  uVar5 = uVar4 + uVar14 + (uVar7 ^ uVar23 ^ uVar19) + 0xe6db99e5;
  uVar8 = uVar5 * 0x800 + uVar19 + (uVar5 >> 0x15 & 0x7ff);
  uVar5 = (uVar19 ^ uVar7 ^ uVar8) + 0x1fa27cf8 + uVar23 + uVar17;
  uVar4 = uVar5 * 0x10000 + uVar8 + (uVar5 >> 0x10 & 0xffff);
  uVar5 = uVar7 + uVar18 + (uVar8 ^ uVar19 ^ uVar4) + 0xc4ac5665;
  uVar7 = uVar5 * 0x800000 + uVar4 + (uVar5 >> 9 & 0x7fffff);
  uVar5 = uVar19 + uVar25 + ((~uVar8 | uVar7) ^ uVar4) + 0xf4292244;
  uVar19 = uVar5 * 0x40 + uVar7 + (uVar5 >> 0x1a & 0x3f);
  uVar5 = ((~uVar4 | uVar19) ^ uVar7) + 0x432aff97 + uVar8 + uVar10;
  uVar10 = uVar5 * 0x400 + uVar19 + (uVar5 >> 0x16 & 0x3ff);
  uVar5 = uVar4 + uVar16 + ((~uVar7 | uVar10) ^ uVar19) + 0xab9423a7;
  uVar8 = uVar5 * 0x8000 + uVar10 + (uVar5 >> 0x11 & 0x7fff);
  uVar5 = uVar7 + uVar12 + ((~uVar19 | uVar8) ^ uVar10) + 0xfc93a039;
  uVar4 = uVar5 * 0x200000 + uVar8 + (uVar5 >> 0xb & 0x1fffff);
  uVar5 = ((~uVar10 | uVar4) ^ uVar8) + 0x655b59c3 + uVar19 + uVar14;
  uVar7 = uVar5 * 0x40 + uVar4 + (uVar5 >> 0x1a & 0x3f);
  uVar5 = uVar10 + uVar6 + ((~uVar8 | uVar7) ^ uVar4) + 0x8f0ccc92;
  uVar16 = uVar5 * 0x400 + uVar7 + (uVar5 >> 0x16 & 0x3ff);
  uVar5 = uVar8 + uVar20 + ((~uVar4 | uVar16) ^ uVar7) + 0xffeff47d;
  uVar8 = uVar5 * 0x8000 + uVar16 + (uVar5 >> 0x11 & 0x7fff);
  uVar5 = uVar4 + uVar21 + 0x85845dd1 + ((~uVar7 | uVar8) ^ uVar16);
  uVar21 = uVar5 * 0x200000 + uVar8 + (uVar5 >> 0xb & 0x1fffff);
  uVar5 = ((~uVar16 | uVar21) ^ uVar8) + 0x6fa87e4f + uVar7 + uVar11;
  uVar6 = uVar5 * 0x40 + uVar21 + (uVar5 >> 0x1a & 0x3f);
  uVar5 = uVar16 + uVar17 + ((~uVar8 | uVar6) ^ uVar21) + 0xfe2ce6e0;
  uVar4 = uVar5 * 0x400 + uVar6 + (uVar5 >> 0x16 & 0x3ff);
  uVar5 = uVar8 + uVar9 + ((~uVar21 | uVar4) ^ uVar6) + 0xa3014314;
  uVar7 = uVar5 * 0x8000 + uVar4 + (uVar5 >> 0x11 & 0x7fff);
  uVar5 = ((~uVar6 | uVar7) ^ uVar4) + 0x4e0811a1 + uVar21 + uVar24;
  uVar8 = uVar5 * 0x200000 + uVar7 + (uVar5 >> 0xb & 0x1fffff);
  uVar5 = uVar6 + uVar15 + ((~uVar4 | uVar8) ^ uVar7) + 0xf7537e82;
  uVar6 = uVar5 * 0x40 + uVar8 + (uVar5 >> 0x1a & 0x3f);
  uVar5 = uVar4 + uVar13 + ((~uVar7 | uVar6) ^ uVar8) + 0xbd3af235;
  uVar4 = uVar5 * 0x400 + uVar6 + (uVar5 >> 0x16 & 0x3ff);
  uVar5 = ((~uVar8 | uVar4) ^ uVar6) + 0x2ad7d2bb + uVar7 + uVar18;
  uVar7 = uVar5 * 0x8000 + uVar4 + (uVar5 >> 0x11 & 0x7fff);
  ctx->state[0] = uVar6 + ctx->state[0];
  uVar5 = uVar8 + uVar22 + ((~uVar6 | uVar7) ^ uVar4) + 0xeb86d391;
  ctx->state[1] = uVar2 + uVar7 + uVar5 * 0x200000 + (uVar5 >> 0xb & 0x1fffff);
  ctx->state[2] = uVar7 + uVar3;
  ctx->state[3] = uVar4 + uVar1;
  return;
}

Assistant:

static void md5_process( md5_context *ctx, unsigned char data[64] )
{
    unsigned long X[16], A, B, C, D;

    GET_ULONG_LE( X[ 0], data,  0 );
    GET_ULONG_LE( X[ 1], data,  4 );
    GET_ULONG_LE( X[ 2], data,  8 );
    GET_ULONG_LE( X[ 3], data, 12 );
    GET_ULONG_LE( X[ 4], data, 16 );
    GET_ULONG_LE( X[ 5], data, 20 );
    GET_ULONG_LE( X[ 6], data, 24 );
    GET_ULONG_LE( X[ 7], data, 28 );
    GET_ULONG_LE( X[ 8], data, 32 );
    GET_ULONG_LE( X[ 9], data, 36 );
    GET_ULONG_LE( X[10], data, 40 );
    GET_ULONG_LE( X[11], data, 44 );
    GET_ULONG_LE( X[12], data, 48 );
    GET_ULONG_LE( X[13], data, 52 );
    GET_ULONG_LE( X[14], data, 56 );
    GET_ULONG_LE( X[15], data, 60 );

#define S(x,n) ((x << n) | ((x & 0xFFFFFFFF) >> (32 - n)))

#define P(a,b,c,d,k,s,t)                                \
{                                                       \
    a += F(b,c,d) + X[k] + t; a = S(a,s) + b;           \
}

    A = ctx->state[0];
    B = ctx->state[1];
    C = ctx->state[2];
    D = ctx->state[3];

#define F(x,y,z) (z ^ (x & (y ^ z)))

    P( A, B, C, D,  0,  7, 0xD76AA478 );
    P( D, A, B, C,  1, 12, 0xE8C7B756 );
    P( C, D, A, B,  2, 17, 0x242070DB );
    P( B, C, D, A,  3, 22, 0xC1BDCEEE );
    P( A, B, C, D,  4,  7, 0xF57C0FAF );
    P( D, A, B, C,  5, 12, 0x4787C62A );
    P( C, D, A, B,  6, 17, 0xA8304613 );
    P( B, C, D, A,  7, 22, 0xFD469501 );
    P( A, B, C, D,  8,  7, 0x698098D8 );
    P( D, A, B, C,  9, 12, 0x8B44F7AF );
    P( C, D, A, B, 10, 17, 0xFFFF5BB1 );
    P( B, C, D, A, 11, 22, 0x895CD7BE );
    P( A, B, C, D, 12,  7, 0x6B901122 );
    P( D, A, B, C, 13, 12, 0xFD987193 );
    P( C, D, A, B, 14, 17, 0xA679438E );
    P( B, C, D, A, 15, 22, 0x49B40821 );

#undef F

#define F(x,y,z) (y ^ (z & (x ^ y)))

    P( A, B, C, D,  1,  5, 0xF61E2562 );
    P( D, A, B, C,  6,  9, 0xC040B340 );
    P( C, D, A, B, 11, 14, 0x265E5A51 );
    P( B, C, D, A,  0, 20, 0xE9B6C7AA );
    P( A, B, C, D,  5,  5, 0xD62F105D );
    P( D, A, B, C, 10,  9, 0x02441453 );
    P( C, D, A, B, 15, 14, 0xD8A1E681 );
    P( B, C, D, A,  4, 20, 0xE7D3FBC8 );
    P( A, B, C, D,  9,  5, 0x21E1CDE6 );
    P( D, A, B, C, 14,  9, 0xC33707D6 );
    P( C, D, A, B,  3, 14, 0xF4D50D87 );
    P( B, C, D, A,  8, 20, 0x455A14ED );
    P( A, B, C, D, 13,  5, 0xA9E3E905 );
    P( D, A, B, C,  2,  9, 0xFCEFA3F8 );
    P( C, D, A, B,  7, 14, 0x676F02D9 );
    P( B, C, D, A, 12, 20, 0x8D2A4C8A );

#undef F
    
#define F(x,y,z) (x ^ y ^ z)

    P( A, B, C, D,  5,  4, 0xFFFA3942 );
    P( D, A, B, C,  8, 11, 0x8771F681 );
    P( C, D, A, B, 11, 16, 0x6D9D6122 );
    P( B, C, D, A, 14, 23, 0xFDE5380C );
    P( A, B, C, D,  1,  4, 0xA4BEEA44 );
    P( D, A, B, C,  4, 11, 0x4BDECFA9 );
    P( C, D, A, B,  7, 16, 0xF6BB4B60 );
    P( B, C, D, A, 10, 23, 0xBEBFBC70 );
    P( A, B, C, D, 13,  4, 0x289B7EC6 );
    P( D, A, B, C,  0, 11, 0xEAA127FA );
    P( C, D, A, B,  3, 16, 0xD4EF3085 );
    P( B, C, D, A,  6, 23, 0x04881D05 );
    P( A, B, C, D,  9,  4, 0xD9D4D039 );
    P( D, A, B, C, 12, 11, 0xE6DB99E5 );
    P( C, D, A, B, 15, 16, 0x1FA27CF8 );
    P( B, C, D, A,  2, 23, 0xC4AC5665 );

#undef F

#define F(x,y,z) (y ^ (x | ~z))

    P( A, B, C, D,  0,  6, 0xF4292244 );
    P( D, A, B, C,  7, 10, 0x432AFF97 );
    P( C, D, A, B, 14, 15, 0xAB9423A7 );
    P( B, C, D, A,  5, 21, 0xFC93A039 );
    P( A, B, C, D, 12,  6, 0x655B59C3 );
    P( D, A, B, C,  3, 10, 0x8F0CCC92 );
    P( C, D, A, B, 10, 15, 0xFFEFF47D );
    P( B, C, D, A,  1, 21, 0x85845DD1 );
    P( A, B, C, D,  8,  6, 0x6FA87E4F );
    P( D, A, B, C, 15, 10, 0xFE2CE6E0 );
    P( C, D, A, B,  6, 15, 0xA3014314 );
    P( B, C, D, A, 13, 21, 0x4E0811A1 );
    P( A, B, C, D,  4,  6, 0xF7537E82 );
    P( D, A, B, C, 11, 10, 0xBD3AF235 );
    P( C, D, A, B,  2, 15, 0x2AD7D2BB );
    P( B, C, D, A,  9, 21, 0xEB86D391 );

#undef F

    ctx->state[0] += A;
    ctx->state[1] += B;
    ctx->state[2] += C;
    ctx->state[3] += D;
}